

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gostsum.c
# Opt level: O0

int hash_stream(gost_hash_ctx *ctx,int fd,char *sum)

{
  byte *block;
  long in_RDX;
  int in_ESI;
  int i;
  ssize_t bytes;
  uchar buffer [262144];
  undefined4 in_stack_fffffffffffbffc8;
  undefined4 in_stack_fffffffffffbffcc;
  int iVar1;
  gost_hash_ctx *in_stack_fffffffffffbffd8;
  byte *in_stack_fffffffffffc0038;
  gost_hash_ctx *in_stack_fffffffffffc0040;
  int local_4;
  
  start_hash((gost_hash_ctx *)CONCAT44(in_stack_fffffffffffbffcc,in_stack_fffffffffffbffc8));
  while( true ) {
    block = (byte *)read(in_ESI,&stack0xfffffffffffbffd8,0x40000);
    if ((long)block < 1) break;
    hash_block(in_stack_fffffffffffbffd8,block,
               CONCAT44(in_stack_fffffffffffbffcc,in_stack_fffffffffffbffc8));
  }
  if ((long)block < 0) {
    local_4 = 0;
  }
  else {
    finish_hash(in_stack_fffffffffffc0040,in_stack_fffffffffffc0038);
    for (iVar1 = 0; iVar1 < 0x20; iVar1 = iVar1 + 1) {
      sprintf((char *)(in_RDX + (iVar1 << 1)),"%02x",
              (ulong)(byte)(&stack0xfffffffffffbffd8)[0x1f - iVar1]);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int hash_stream(gost_hash_ctx * ctx, int fd, char *sum)
{
    unsigned char buffer[BUF_SIZE];
    ssize_t bytes;
    int i;
    start_hash(ctx);
    while ((bytes = read(fd, buffer, BUF_SIZE)) > 0) {
        hash_block(ctx, buffer, bytes);
    }
    if (bytes < 0) {
        return 0;
    }
    finish_hash(ctx, buffer);
    for (i = 0; i < 32; i++) {
        sprintf(sum + 2 * i, "%02x", buffer[31 - i]);
    }
    return 1;
}